

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

void __thiscall glslang::TFunction::dump(TFunction *this,TInfoSink *infoSink,bool complete)

{
  TType *this_00;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  char *pcVar3;
  TInfoSinkBase *pTVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TString local_1f8;
  pool_allocator<char> local_1d0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_1c8;
  pool_allocator<char> local_1a0;
  byte local_191;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_168;
  pool_allocator<char> local_140;
  TString local_138;
  pool_allocator<char> local_110;
  TString local_108;
  TString local_e0;
  const_reference local_b8;
  TParameter *param;
  int i;
  int numParams;
  TString local_a0;
  pool_allocator<char> local_78;
  TString local_70;
  TString local_48;
  undefined1 local_19;
  TInfoSink *pTStack_18;
  bool complete_local;
  TInfoSink *infoSink_local;
  TFunction *this_local;
  
  local_19 = complete;
  pTStack_18 = infoSink;
  infoSink_local = (TInfoSink *)this;
  if (complete) {
    iVar1 = (*(this->super_TSymbol)._vptr_TSymbol[3])();
    pcVar3 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var,iVar1));
    pTVar4 = TInfoSinkBase::operator<<(&infoSink->debug,pcVar3);
    pTVar4 = TInfoSinkBase::operator<<(pTVar4,": ");
    pool_allocator<char>::pool_allocator(&local_78);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_70,
               "",&local_78);
    pool_allocator<char>::pool_allocator((pool_allocator<char> *)&i);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_a0,
               "",(pool_allocator<char> *)&i);
    TType::getCompleteString(&local_48,&this->returnType,false,true,true,true,&local_70,&local_a0);
    pTVar4 = TInfoSinkBase::operator<<(pTVar4,&local_48);
    pTVar4 = TInfoSinkBase::operator<<(pTVar4," ");
    iVar1 = (*(this->super_TSymbol)._vptr_TSymbol[3])();
    pcVar3 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_00,iVar1));
    pTVar4 = TInfoSinkBase::operator<<(pTVar4,pcVar3);
    TInfoSinkBase::operator<<(pTVar4,"(");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_48);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_a0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_70);
    param._4_4_ = (*(this->super_TSymbol)._vptr_TSymbol[0x24])();
    for (param._0_4_ = 0; (int)param < param._4_4_; param._0_4_ = (int)param + 1) {
      local_b8 = std::vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>::
                 operator[](&(this->parameters).
                             super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>
                            ,(long)(int)param);
      pTVar4 = &pTStack_18->debug;
      this_00 = local_b8->type;
      pool_allocator<char>::pool_allocator(&local_110);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_108,"",&local_110);
      pool_allocator<char>::pool_allocator(&local_140);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_138,"",&local_140);
      TType::getCompleteString(&local_e0,this_00,false,true,true,true,&local_108,&local_138);
      pTVar4 = TInfoSinkBase::operator<<(pTVar4,&local_e0);
      pTVar4 = TInfoSinkBase::operator<<(pTVar4," ");
      uVar2 = (*local_b8->type->_vptr_TType[0x25])();
      local_191 = 0;
      if ((uVar2 & 1) == 0) {
        pool_allocator<char>::pool_allocator(&local_1a0);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_168,"",&local_1a0);
      }
      else {
        iVar1 = (*local_b8->type->_vptr_TType[5])();
        std::operator+(&local_190,"of ",
                       (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )CONCAT44(extraout_var_01,iVar1));
        local_191 = 1;
        std::operator+(&local_168,&local_190," ");
      }
      pTVar4 = TInfoSinkBase::operator<<(pTVar4,&local_168);
      if (local_b8->name == (TString *)0x0) {
        pool_allocator<char>::pool_allocator(&local_1d0);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_1c8,"",&local_1d0);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        basic_string(&local_1c8,local_b8->name);
      }
      pTVar4 = TInfoSinkBase::operator<<(pTVar4,&local_1c8);
      pcVar3 = "";
      if ((int)param < param._4_4_ + -1) {
        pcVar3 = ",";
      }
      TInfoSinkBase::operator<<(pTVar4,pcVar3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_1c8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_168);
      if ((local_191 & 1) != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_190);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_e0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_138);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_108);
    }
    TInfoSinkBase::operator<<(&pTStack_18->debug,")");
    TSymbol::dumpExtensions(&this->super_TSymbol,pTStack_18);
  }
  else {
    iVar1 = (*(this->super_TSymbol)._vptr_TSymbol[3])();
    pcVar3 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_02,iVar1));
    pTVar4 = TInfoSinkBase::operator<<(&infoSink->debug,pcVar3);
    pTVar4 = TInfoSinkBase::operator<<(pTVar4,": ");
    TType::getBasicTypeString_abi_cxx11_(&local_1f8,&this->returnType);
    pTVar4 = TInfoSinkBase::operator<<(pTVar4,&local_1f8);
    pTVar4 = TInfoSinkBase::operator<<(pTVar4," ");
    iVar1 = (*(this->super_TSymbol)._vptr_TSymbol[6])();
    pcVar3 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_03,iVar1));
    pTVar4 = TInfoSinkBase::operator<<(pTVar4,pcVar3);
    TInfoSinkBase::operator<<(pTVar4,"n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_1f8);
  }
  TInfoSinkBase::operator<<(&pTStack_18->debug,"\n");
  return;
}

Assistant:

void TFunction::dump(TInfoSink& infoSink, bool complete) const
{
    if (complete) {
        infoSink.debug << getName().c_str() << ": " << returnType.getCompleteString() << " " << getName().c_str()
                       << "(";

        int numParams = getParamCount();
        for (int i = 0; i < numParams; i++) {
            const TParameter &param = parameters[i];
            infoSink.debug << param.type->getCompleteString() << " "
                           << (param.type->isStruct() ? "of " + param.type->getTypeName() + " " : "")
                           << (param.name ? *param.name : "") << (i < numParams - 1 ? "," : "");
        }

        infoSink.debug << ")";
        dumpExtensions(infoSink);
    } else {
        infoSink.debug << getName().c_str() << ": " << returnType.getBasicTypeString() << " "
                       << getMangledName().c_str() << "n";
    }

    infoSink.debug << "\n";
}